

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_zipx_lzma_alone(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  undefined8 uVar11;
  ssize_t bytes_avail;
  undefined4 local_40;
  int iStack_3c;
  undefined5 uStack_38;
  
  pvVar2 = a->format->data;
  if (*(char *)((long)pvVar2 + 0xa1) == '\0') {
    if (*(char *)((long)pvVar2 + 0x1b8) != '\0') {
      lzma_end((long)pvVar2 + 0x130);
      *(undefined1 *)((long)pvVar2 + 0x1b8) = 0;
    }
    pvVar5 = (void *)((long)pvVar2 + 0x130);
    memset(pvVar5,0,0x88);
    uVar3 = lzma_alone_decoder(pvVar5,0xffffffffffffffff);
    if (uVar3 != 0) {
      archive_set_error(&a->archive,-1,"lzma initialization failed(%d)",(ulong)uVar3);
      return L'\xffffffe7';
    }
    *(undefined1 *)((long)pvVar2 + 0x1b8) = 1;
    if ((*(long *)((long)pvVar2 + 0x78) < 9) ||
       (pvVar6 = __archive_read_ahead(a,9,(ssize_t *)0x0), pvVar6 == (void *)0x0)) {
      pcVar10 = "Truncated lzma data";
    }
    else {
      if ((*(char *)((long)pvVar6 + 2) == '\x05') && (*(char *)((long)pvVar6 + 3) == '\0')) {
        local_40 = *(undefined4 *)((long)pvVar6 + 4);
        iStack_3c = CONCAT31(0xffffff,*(undefined1 *)((long)pvVar6 + 8));
        uStack_38 = 0xffffffffff;
        pvVar6 = *(void **)((long)pvVar2 + 0xa8);
        if (pvVar6 == (void *)0x0) {
          *(undefined8 *)((long)pvVar2 + 0xb0) = 0x40000;
          uVar11 = 0x40000;
          pvVar6 = malloc(0x40000);
          *(void **)((long)pvVar2 + 0xa8) = pvVar6;
          if (pvVar6 == (void *)0x0) {
            pcVar10 = "No memory for lzma decompression";
            iVar4 = 0xc;
            goto LAB_0013bbb0;
          }
        }
        else {
          uVar11 = *(undefined8 *)((long)pvVar2 + 0xb0);
        }
        *(undefined4 **)((long)pvVar2 + 0x130) = &local_40;
        *(undefined8 *)((long)pvVar2 + 0x138) = 0xd;
        *(undefined8 *)((long)pvVar2 + 0x140) = 0;
        *(void **)((long)pvVar2 + 0x148) = pvVar6;
        *(undefined8 *)((long)pvVar2 + 0x150) = uVar11;
        *(undefined8 *)((long)pvVar2 + 0x158) = 0;
        iVar4 = lzma_code(pvVar5,0);
        if (iVar4 != 0) {
          pcVar10 = "lzma stream initialization error";
          iVar4 = 0x16;
          goto LAB_0013bbb0;
        }
        __archive_read_consume(a,9);
        *(long *)((long)pvVar2 + 0x78) = *(long *)((long)pvVar2 + 0x78) + -9;
        *(long *)((long)pvVar2 + 0x80) = *(long *)((long)pvVar2 + 0x80) + 9;
        *(undefined1 *)((long)pvVar2 + 0xa1) = 1;
        goto LAB_0013b9c0;
      }
      pcVar10 = "Invalid lzma data";
    }
  }
  else {
LAB_0013b9c0:
    pvVar5 = __archive_read_ahead(a,1,(ssize_t *)&local_40);
    if (-1 < iStack_3c) {
      lVar9 = CONCAT44(iStack_3c,local_40);
      if (*(long *)((long)pvVar2 + 0x78) < CONCAT44(iStack_3c,local_40)) {
        lVar9 = *(long *)((long)pvVar2 + 0x78);
      }
      *(void **)((long)pvVar2 + 0x130) = pvVar5;
      *(long *)((long)pvVar2 + 0x138) = lVar9;
      *(undefined8 *)((long)pvVar2 + 0x140) = 0;
      *(undefined8 *)((long)pvVar2 + 0x148) = *(undefined8 *)((long)pvVar2 + 0xa8);
      lVar9 = *(long *)(*(long *)((long)pvVar2 + 0x70) + 0x30) - *(long *)((long)pvVar2 + 0x88);
      if (*(long *)((long)pvVar2 + 0xb0) < lVar9) {
        lVar9 = *(long *)((long)pvVar2 + 0xb0);
      }
      *(long *)((long)pvVar2 + 0x150) = lVar9;
      *(undefined8 *)((long)pvVar2 + 0x158) = 0;
      uVar3 = lzma_code((long)pvVar2 + 0x130,0);
      if (uVar3 == 9) {
        pcVar10 = "lzma data error (error %d)";
        uVar8 = 9;
LAB_0013bb98:
        archive_set_error(&a->archive,-1,pcVar10,uVar8);
        return L'\xffffffe2';
      }
      if (uVar3 == 1) {
        lVar9 = *(long *)((long)pvVar2 + 0x140);
        if (lVar9 != *(long *)((long)pvVar2 + 0x78)) {
          pcVar10 = "lzma alone premature end of stream";
          iVar4 = -1;
          goto LAB_0013bbb0;
        }
        *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
      }
      else {
        if (uVar3 != 0) {
          pcVar10 = "lzma unknown error %d";
          uVar8 = (ulong)uVar3;
          goto LAB_0013bb98;
        }
        lVar9 = *(long *)((long)pvVar2 + 0x140);
      }
      __archive_read_consume(a,lVar9);
      *(long *)((long)pvVar2 + 0x80) = *(long *)((long)pvVar2 + 0x80) + lVar9;
      sVar7 = *(size_t *)((long)pvVar2 + 0x158);
      *(long *)((long)pvVar2 + 0x88) = *(long *)((long)pvVar2 + 0x88) + sVar7;
      plVar1 = (long *)((long)pvVar2 + 0x78);
      *plVar1 = *plVar1 - lVar9;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)pvVar2 + 0xa2) = 1;
      }
      else if (*(char *)((long)pvVar2 + 0xa2) == '\0') goto LAB_0013bbea;
      lzma_end((long)pvVar2 + 0x130);
      *(undefined1 *)((long)pvVar2 + 0x1b8) = 0;
      sVar7 = *(size_t *)((long)pvVar2 + 0x158);
LAB_0013bbea:
      *size = sVar7;
      *buff = *(void **)((long)pvVar2 + 0xa8);
      return L'\0';
    }
    pcVar10 = "Truncated lzma file body";
  }
  iVar4 = 0x54;
LAB_0013bbb0:
  archive_set_error(&a->archive,iVar4,pcVar10);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_lzma_alone(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_lzma_alone_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	/* Fetch more compressed data. The same note as in deflate handler
	 * applies here as well:
	 *
	 * Note: '1' here is a performance optimization. Recall that the
	 * decompression layer returns a count of available bytes; asking for
	 * more than that forces the decompressor to combine reads by copying
	 * data.
	 */
	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated lzma file body");
		return (ARCHIVE_FATAL);
	}

	/* Set decompressor parameters. */
	in_bytes = (ssize_t)zipmin(zip->entry_bytes_remaining, bytes_avail);

	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out =
		/* These lzma_alone streams lack end of stream marker, so let's
		 * make sure the unpacker won't try to unpack more than it's
		 * supposed to. */
		(size_t)zipmin((int64_t) zip->uncompressed_buffer_size,
		    zip->entry->uncompressed_size -
		    zip->entry_uncompressed_bytes_read);
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		/* This case is optional in lzma alone format. It can happen,
		 * but most of the files don't have it. (GitHub #1257) */
		case LZMA_STREAM_END:
			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "lzma alone premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;

		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);
	}

	to_consume = (ssize_t)zip->zipx_lzma_stream.total_in;

	/* Update pointers. */
	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	if(zip->entry_bytes_remaining == 0) {
		zip->end_of_entry = 1;
	}

	/* Free lzma decoder handle because we'll no longer need it. */
	/* This cannot be folded into LZMA_STREAM_END handling above
	 * because the stream end marker is not required in this format. */
	if(zip->end_of_entry) {
		lzma_end(&zip->zipx_lzma_stream);
		zip->zipx_lzma_valid = 0;
	}

	/* Return values. */
	*size = (size_t)zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	/* If we're here, then we're good! */
	return (ARCHIVE_OK);
}